

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShader_gl_in_ArrayLengthTest::deinit(GeometryShader_gl_in_ArrayLengthTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference ppCVar4;
  Case *test;
  undefined1 local_38 [8];
  iterator it;
  Functions *gl;
  GeometryShader_gl_in_ArrayLengthTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  it._M_node = (_Map_pointer)CONCAT44(extraout_var,iVar2);
  (*(code *)it._M_node[0x2d0])(0);
  (*(code *)it._M_node[0x1b])(0);
  (*(code *)it._M_node[9])(0x8c8e,0);
  (*(code *)it._M_node[8])(0x8892,0);
  if (this->m_vertex_array_object_id != 0) {
    (*(code *)it._M_node[0x92])(1,&this->m_vertex_array_object_id);
  }
  if (this->m_buffer_object_id != 0) {
    (*(code *)it._M_node[0x87])(1,&this->m_buffer_object_id);
  }
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::begin((iterator *)local_38,&this->m_tests);
  while( true ) {
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
    ::end((iterator *)&test,&this->m_tests);
    bVar1 = std::operator!=((_Self *)local_38,(_Self *)&test);
    if (!bVar1) break;
    ppCVar4 = std::
              _Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
              ::operator*((_Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
                           *)local_38);
    deinitCase(this,*ppCVar4);
    std::
    _Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
    ::operator++((_Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
                  *)local_38);
  }
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::clear(&this->m_tests);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShader_gl_in_ArrayLengthTest::deinit()
{
	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind default values */
	gl.useProgram(0);
	gl.bindVertexArray(0);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, 0 /* id */);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	/* Delete everything */
	if (0 != m_vertex_array_object_id)
	{
		gl.deleteVertexArrays(1, &m_vertex_array_object_id);
	}

	if (0 != m_buffer_object_id)
	{
		gl.deleteBuffers(1, &m_buffer_object_id);
	}

	/* Deinit test cases */
	for (testContainer::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		Case* test = *it;

		deinitCase(*test);
	}

	m_tests.clear();

	/* Deinitialize Base */
	TestCaseBase::deinit();
}